

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportBuildFileGenerator::GetCxxModulesDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->CxxModulesDirectory);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportBuildFileGenerator::GetCxxModulesDirectory() const
{
  return this->CxxModulesDirectory;
}